

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma.cc
# Opt level: O1

void __thiscall pstack::LzmaReader::LzmaReader(LzmaReader *this,csptr *upstream_)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Reader *this_00;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  undefined4 extraout_var;
  Exception *pEVar6;
  Off OVar7;
  undefined1 *puStack_220;
  Exception local_218;
  undefined8 uStack_78;
  lzma_stream_flags options;
  uint8_t footer [12];
  
  (this->super_Reader).super_enable_shared_from_this<pstack::Reader>._M_weak_this.
  super___weak_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Reader).super_enable_shared_from_this<pstack::Reader>._M_weak_this.
  super___weak_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Reader)._vptr_Reader = (_func_int **)&PTR__LzmaReader_0017cb98;
  this->index = (lzma_index *)0x0;
  this->memlimit = 0xffffffffffffffff;
  this->pos = 0;
  (this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (upstream_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (upstream_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (upstream_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (upstream_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  p_Var1 = &(this->lzBlocks)._M_t._M_impl.super__Rb_tree_header;
  (this->lzBlocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lzBlocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->lzBlocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->lzBlocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->lzBlocks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  options.reserved_bool5 = '\0';
  options.reserved_bool6 = '\0';
  options.reserved_bool7 = '\0';
  options.reserved_bool8 = '\0';
  options.reserved_int1 = 0;
  options.reserved_enum2 = LZMA_RESERVED_ENUM;
  options.reserved_enum3 = LZMA_RESERVED_ENUM;
  options.reserved_enum4 = LZMA_RESERVED_ENUM;
  options.reserved_bool1 = '\0';
  options.reserved_bool2 = '\0';
  options.reserved_bool3 = '\0';
  options.reserved_bool4 = '\0';
  options.backward_size = 0;
  options.check = LZMA_CHECK_NONE;
  options.reserved_enum1 = LZMA_RESERVED_ENUM;
  uStack_78 = 0;
  options.version = 0;
  options._4_4_ = 0;
  puStack_220 = (undefined1 *)0x1644d1;
  iVar5 = (*((this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_Reader[8])();
  OVar7 = CONCAT44(extraout_var,iVar5) - 0xc;
  puStack_220 = (undefined1 *)0x1644ed;
  Reader::readObj<unsigned_char>
            ((this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,OVar7,&options.field_0x34,0xc);
  puStack_220 = (undefined1 *)0x1644fa;
  iVar5 = lzma_stream_footer_decode(&uStack_78);
  uVar4 = options._0_8_;
  if (iVar5 != 0) {
    puStack_220 = (undefined1 *)0x164572;
    pEVar6 = (Exception *)__cxa_allocate_exception(0x1a0);
    puStack_220 = (undefined1 *)0x16458b;
    memset(&local_218,0,0x1a0);
    puStack_220 = (undefined1 *)0x164593;
    Exception::Exception(&local_218);
    puStack_220 = (undefined1 *)0x1645b1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_218.str,"LZMA error reading footer: ",0x1b);
    puStack_220 = (undefined1 *)0x1645bc;
    std::ostream::operator<<(&local_218.str,iVar5);
    puStack_220 = (undefined1 *)0x1645cb;
    Exception::Exception(pEVar6,&local_218);
    puStack_220 = &LAB_001645e4;
    __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
  }
  OVar7 = OVar7 - options._0_8_;
  lVar3 = -(options._0_8_ + 0xf & 0xfffffffffffffff0);
  this_00 = (this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  *(undefined8 *)((long)&puStack_220 + lVar3) = 0x16452c;
  Reader::readObj<unsigned_char>(this_00,OVar7,(uchar *)((long)&local_218 + lVar3),uVar4);
  uVar4 = options._0_8_;
  *(undefined8 *)((long)&puStack_220 + lVar3) = 0x16454b;
  iVar5 = lzma_index_buffer_decode
                    (&this->index,&this->memlimit,allocator()::alloc,
                     (uchar *)((long)&local_218 + lVar3),&this->pos,uVar4);
  if (iVar5 == 0) {
    return;
  }
  *(undefined8 *)((long)&puStack_220 + lVar3) = 0x1645f0;
  pEVar6 = (Exception *)__cxa_allocate_exception(0x1a0);
  *(undefined8 *)((long)&puStack_220 + lVar3) = 0x164609;
  memset(&local_218,0,0x1a0);
  *(undefined8 *)((long)&puStack_220 + lVar3) = 0x164611;
  Exception::Exception(&local_218);
  *(undefined8 *)((long)&puStack_220 + lVar3) = 0x16462c;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218.str,"can\'t decode index buffer",0x19);
  *(undefined8 *)((long)&puStack_220 + lVar3) = 0x16463b;
  Exception::Exception(pEVar6,&local_218);
  *(undefined1 **)((long)&puStack_220 + lVar3) = &LAB_00164654;
  __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

LzmaReader::LzmaReader(Reader::csptr upstream_)
    : index{}
    , upstream{std::move(upstream_)}
{
   lzma_stream_flags options{};

   // read the last LZMA_STREAM_HEADER_SIZE bytes into footer.
   uint8_t footer[LZMA_STREAM_HEADER_SIZE];
   size_t off = upstream->size() - sizeof footer;
   upstream->readObj(off, footer, sizeof footer);

   auto rc = lzma_stream_footer_decode(&options, footer);
   if (rc != LZMA_OK)
       throw (Exception() << "LZMA error reading footer: " << rc);
   off -= options.backward_size;
   uint8_t indexBuffer[options.backward_size];
   upstream->readObj(off, indexBuffer, options.backward_size);
   rc = lzma_index_buffer_decode(&index, &memlimit, allocator(), indexBuffer, &pos,
         options.backward_size);
   if (rc != LZMA_OK)
       throw (Exception() << "can't decode index buffer");
}